

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_0::RelativeChangeCase::logAnalysis
          (RelativeChangeCase *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          *samples)

{
  allocator<tcu::Vector<float,_2>_> *this_00;
  Sample *pSVar1;
  bool bVar2;
  TestLog *this_01;
  size_type sVar3;
  Sample *pSVar4;
  reference pvVar5;
  MessageBuilder *pMVar6;
  int precision;
  float fVar7;
  float fVar8;
  string local_1190;
  MessageBuilder local_1170;
  allocator<char> local_fe9;
  string local_fe8;
  MessageBuilder local_fc8;
  allocator<char> local_e41;
  string local_e40;
  MessageBuilder local_e20;
  allocator<char> local_c99;
  string local_c98;
  MessageBuilder local_c78;
  MessageBuilder local_af8;
  MessageBuilder local_978;
  MessageBuilder local_7f8;
  MessageBuilder local_678;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  LogSection local_4a8;
  MessageBuilder local_468;
  allocator<char> local_2e1;
  string local_2e0;
  MessageBuilder local_2c0;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  LineParametersWithConfidence testParam;
  LineParametersWithConfidence baseParam;
  LineParametersWithConfidence nullParam;
  float confidence;
  Vector<float,_2> local_b8;
  Vector<float,_2> local_b0;
  const_reference local_a8;
  Sample *sample;
  size_t ndx;
  undefined1 local_90 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> testSamples;
  undefined1 local_70 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> baseSamples;
  allocator<tcu::Vector<float,_2>_> local_41;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> nullSamples;
  int maxWorkload;
  TestLog *log;
  vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  *samples_local;
  RelativeChangeCase *this_local;
  
  this_01 = tcu::TestContext::getLog((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  nullSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  sVar3 = std::
          vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          ::size(samples);
  std::allocator<tcu::Vector<float,_2>_>::allocator(&local_41);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_40,
             sVar3,&local_41);
  std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_41);
  sVar3 = std::
          vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          ::size(samples);
  this_00 = (allocator<tcu::Vector<float,_2>_> *)
            ((long)&testSamples.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_2>_>::allocator(this_00);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_70,
             sVar3,this_00);
  std::allocator<tcu::Vector<float,_2>_>::~allocator
            ((allocator<tcu::Vector<float,_2>_> *)
             ((long)&testSamples.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = std::
          vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          ::size(samples);
  std::allocator<tcu::Vector<float,_2>_>::allocator
            ((allocator<tcu::Vector<float,_2>_> *)((long)&ndx + 7));
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_90,
             sVar3,(allocator<tcu::Vector<float,_2>_> *)((long)&ndx + 7));
  std::allocator<tcu::Vector<float,_2>_>::~allocator
            ((allocator<tcu::Vector<float,_2>_> *)((long)&ndx + 7));
  for (sample = (Sample *)0x0; pSVar1 = sample,
      pSVar4 = (Sample *)
               std::
               vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
               ::size(samples), pSVar1 < pSVar4; sample = (Sample *)((long)&sample->nullTime + 1)) {
    local_a8 = std::
               vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
               ::operator[](samples,(size_type)sample);
    tcu::Vector<float,_2>::Vector(&local_b0,(float)local_a8->workload,(float)local_a8->nullTime);
    pvVar5 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_40,(size_type)sample);
    *&pvVar5->m_data = local_b0.m_data;
    tcu::Vector<float,_2>::Vector(&local_b8,(float)local_a8->workload,(float)local_a8->baseTime);
    pvVar5 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_70,(size_type)sample);
    *&pvVar5->m_data = local_b8.m_data;
    tcu::Vector<float,_2>::Vector
              ((Vector<float,_2> *)&nullParam.confidence,(float)local_a8->workload,
               (float)local_a8->testTime);
    pvVar5 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_90,(size_type)sample);
    *(undefined8 *)pvVar5->m_data = stack0xffffffffffffff40;
    nullSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         de::max<int>(nullSamples.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_a8->workload);
  }
  nullParam.coefficientConfidenceLower = 0.6;
  deqp::gls::theilSenSiegelLinearRegression
            ((LineParametersWithConfidence *)&baseParam.coefficientConfidenceLower,
             (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_40,0.6)
  ;
  deqp::gls::theilSenSiegelLinearRegression
            ((LineParametersWithConfidence *)&testParam.coefficientConfidenceLower,
             (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_70,0.6)
  ;
  deqp::gls::theilSenSiegelLinearRegression
            ((LineParametersWithConfidence *)local_118,
             (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_90,0.6)
  ;
  bVar2 = de::inRange<float>(0.0,nullParam.coefficient,nullParam.offsetConfidenceLower);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Constant operation sequence duration not constant",&local_139);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    tcu::TestLog::operator<<(&local_2c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_2c0,
                        (char (*) [100])
                        "Constant operation sequence timing may vary as a function of workload. Result quality extremely low"
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2c0);
  }
  bVar2 = de::inRange<float>(0.0,baseParam.coefficient,baseParam.offsetConfidenceLower);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"Workload has no effect on duration",&local_2e1);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    tcu::TestLog::operator<<(&local_468,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_468,
                        (char (*) [71])
                        "Workload factor has no effect on duration of sample (smart optimizer?)");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_468);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"Linear Regression",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"Linear Regression",&local_4f1);
  tcu::LogSection::LogSection(&local_4a8,&local_4c8,&local_4f0);
  tcu::TestLog::operator<<(this_01,&local_4a8);
  tcu::LogSection::~LogSection(&local_4a8);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  tcu::TestLog::operator<<(&local_678,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_678,
                      (char (*) [143])
                      "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is "
                     );
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&nullParam.coefficientConfidenceLower);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_678);
  tcu::TestLog::operator<<(&local_7f8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_7f8,(char (*) [34])"Render time for empty scene was\n\t");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c316fc);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&nullParam.offset);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&baseParam.coefficientConfidenceLower);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&baseParam.confidence);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [6])"]us +");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c316fc);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&nullParam.coefficient);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&nullParam.offsetConfidenceUpper);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&nullParam.offsetConfidenceLower);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])"us/workload");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_7f8);
  tcu::TestLog::operator<<(&local_978,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_978,(char (*) [47])"Render time for scene without depth test was\n\t");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c316fc);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&baseParam.offset);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&testParam.coefficientConfidenceLower);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&testParam.confidence);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [6])"]us +");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c316fc);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&baseParam.coefficient);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&baseParam.offsetConfidenceUpper);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&baseParam.offsetConfidenceLower);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])"us/workload");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_978);
  tcu::TestLog::operator<<(&local_af8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_af8,(char (*) [44])"Render time for scene with depth test was\n\t");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c316fc);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&testParam.offset);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)local_118);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)(local_118 + 4));
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [6])"]us +");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c316fc);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&testParam.coefficient);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&testParam.offsetConfidenceUpper);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&testParam.offsetConfidenceLower);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])"us/workload");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_af8);
  tcu::TestLog::operator<<(this_01,(EndSectionToken *)&tcu::TestLog::EndSection);
  bVar2 = de::inRange<float>(0.0,testParam.coefficient,testParam.offsetConfidenceLower);
  if (bVar2) {
    tcu::TestLog::operator<<(&local_c78,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_c78,(char (*) [47])"Test duration not dependent on culled workload");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_c78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c98,"0.0",&local_c99);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,&local_c98);
    std::__cxx11::string::~string((string *)&local_c98);
    std::allocator<char>::~allocator(&local_c99);
  }
  else if (testParam.offsetConfidenceLower * 0.25 <= testParam.coefficient) {
    if (baseParam.offsetConfidenceLower * 0.25 <= baseParam.coefficient) {
      tcu::TestLog::operator<<(&local_1170,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_1170,(char (*) [46])"Test duration is dependent on culled workload"
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1170);
      fVar7 = de::abs<float>(testParam.offsetConfidenceUpper);
      fVar8 = de::abs<float>(baseParam.offsetConfidenceUpper);
      de::floatToString_abi_cxx11_(&local_1190,(de *)0x2,fVar7 / fVar8,precision);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,&local_1190);
      std::__cxx11::string::~string((string *)&local_1190);
    }
    else {
      tcu::TestLog::operator<<(&local_fc8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_fc8,
                          (char (*) [98])
                          "Coefficient confidence range for base render time is extremely large, cannot give reliable result"
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_fc8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fe8,"Result confidence extremely low",&local_fe9);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,&local_fe8);
      std::__cxx11::string::~string((string *)&local_fe8);
      std::allocator<char>::~allocator(&local_fe9);
    }
  }
  else {
    tcu::TestLog::operator<<(&local_e20,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_e20,
                        (char (*) [77])
                        "Coefficient confidence range is extremely large, cannot give reliable result"
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_e20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e40,"Result confidence extremely low",&local_e41);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,&local_e40);
    std::__cxx11::string::~string((string *)&local_e40);
    std::allocator<char>::~allocator(&local_e41);
  }
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_90);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_70);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_40);
  return;
}

Assistant:

void RelativeChangeCase::logAnalysis (const vector<Sample>& samples)
{
	using namespace gls;

	TestLog&		log			= m_testCtx.getLog();

	int				maxWorkload	= 0;

	vector<Vec2>	nullSamples	(samples.size());
	vector<Vec2>	baseSamples	(samples.size());
	vector<Vec2>	testSamples	(samples.size());

	for (size_t ndx = 0; ndx < samples.size(); ndx++)
	{
		const Sample& sample = samples[ndx];

		nullSamples[ndx] = Vec2((float)sample.workload, (float)sample.nullTime);
		baseSamples[ndx] = Vec2((float)sample.workload, (float)sample.baseTime);
		testSamples[ndx] = Vec2((float)sample.workload, (float)sample.testTime);

		maxWorkload = de::max(maxWorkload, sample.workload);
	}

	{
		const float							confidence	= 0.60f;

		const LineParametersWithConfidence	nullParam	= theilSenSiegelLinearRegression(nullSamples, confidence);
		const LineParametersWithConfidence	baseParam	= theilSenSiegelLinearRegression(baseSamples, confidence);
		const LineParametersWithConfidence	testParam	= theilSenSiegelLinearRegression(testSamples, confidence);

		if (!de::inRange(0.0f, nullParam.coefficientConfidenceLower, nullParam.coefficientConfidenceUpper))
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Constant operation sequence duration not constant");
			log << TestLog::Message << "Constant operation sequence timing may vary as a function of workload. Result quality extremely low" << TestLog::EndMessage;
		}

		if (de::inRange(0.0f, baseParam.coefficientConfidenceLower, baseParam.coefficientConfidenceUpper))
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Workload has no effect on duration");
			log << TestLog::Message << "Workload factor has no effect on duration of sample (smart optimizer?)" << TestLog::EndMessage;
		}

		log << TestLog::Section("Linear Regression", "Linear Regression");
		log << TestLog::Message << "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is " << confidence << TestLog::EndMessage;

		log << TestLog::Message << "Render time for empty scene was\n\t"
			<< "[" << nullParam.offsetConfidenceLower << ", " << nullParam.offset <<  ", " << nullParam.offsetConfidenceUpper << "]us +"
			<< "[" << nullParam.coefficientConfidenceLower << ", " << nullParam.coefficient << ", " << nullParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;

		log << TestLog::Message << "Render time for scene without depth test was\n\t"
			<< "[" << baseParam.offsetConfidenceLower << ", " << baseParam.offset <<  ", " << baseParam.offsetConfidenceUpper << "]us +"
			<< "[" << baseParam.coefficientConfidenceLower << ", " << baseParam.coefficient << ", " << baseParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;

		log << TestLog::Message << "Render time for scene with depth test was\n\t"
			<< "[" << testParam.offsetConfidenceLower << ", " << testParam.offset <<  ", " << testParam.offsetConfidenceUpper << "]us +"
			<< "[" << testParam.coefficientConfidenceLower << ", " << testParam.coefficient << ", " << testParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;

		log << TestLog::EndSection;

		if (de::inRange(0.0f, testParam.coefficientConfidenceLower, testParam.coefficientConfidenceUpper))
		{
			log << TestLog::Message << "Test duration not dependent on culled workload" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "0.0");
		}
		else if (testParam.coefficientConfidenceLower < testParam.coefficientConfidenceUpper*0.25)
		{
			log << TestLog::Message << "Coefficient confidence range is extremely large, cannot give reliable result" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Result confidence extremely low");
		}
		else if (baseParam.coefficientConfidenceLower < baseParam.coefficientConfidenceUpper*0.25)
		{
			log << TestLog::Message << "Coefficient confidence range for base render time is extremely large, cannot give reliable result" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Result confidence extremely low");
		}
		else
		{
			log << TestLog::Message << "Test duration is dependent on culled workload" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, de::floatToString(de::abs(testParam.coefficient)/de::abs(baseParam.coefficient), 2));
		}
	}
}